

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.cc
# Opt level: O0

uint32_t crc32_1(void *data,size_t len,uint32_t prev_value)

{
  uint8_t *cur;
  uint32_t crc;
  uint32_t prev_value_local;
  size_t len_local;
  void *data_local;
  
  crc = prev_value ^ 0xffffffff;
  cur = (uint8_t *)data;
  len_local = len;
  while (len_local != 0) {
    crc = crc >> 8 ^ crc_lookup[0][crc & 0xff ^ (uint)*cur];
    cur = cur + 1;
    len_local = len_local - 1;
  }
  return crc ^ 0xffffffff;
}

Assistant:

uint32_t crc32_1(const void* data, size_t len, uint32_t prev_value)
{
    uint32_t crc = ~prev_value;
    const uint8_t* cur = (const uint8_t*) data;

    while (len-- > 0)
        crc = (crc >> 8) ^ crc_lookup[0][(crc & 0xFF) ^ *cur++];

    return ~crc;
}